

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_data.hpp
# Opt level: O2

void duckdb::ArrowEnumData<signed_char>::EnumAppendVector
               (ArrowAppendData *append_data,Vector *input,idx_t size)

{
  ArrowBuffer *this;
  ArrowBuffer *this_00;
  ArrowBuffer *buffer;
  data_ptr_t pdVar1;
  ulong *puVar2;
  void *__src;
  int iVar3;
  idx_t bytes;
  long lVar4;
  idx_t iVar5;
  bool bVar6;
  undefined8 local_40;
  void *local_38;
  
  this = ArrowAppendData::GetMainBuffer(append_data);
  this_00 = ArrowAppendData::GetAuxBuffer(append_data);
  buffer = ArrowAppendData::GetValidityBuffer(append_data);
  ResizeValidity(buffer,append_data->row_count + size);
  ArrowBuffer::resize(this,this->count + size * 4 + 4);
  puVar2 = (ulong *)input->data;
  pdVar1 = this->dataptr;
  iVar5 = append_data->row_count;
  if (iVar5 == 0) {
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
  }
  iVar3 = *(int *)(pdVar1 + iVar5 * 4);
  iVar5 = size;
  while( true ) {
    pdVar1 = pdVar1 + 4;
    bVar6 = iVar5 == 0;
    iVar5 = iVar5 - 1;
    if (bVar6) break;
    lVar4 = (long)iVar3;
    bytes = (ulong)(uint)*puVar2 + lVar4;
    iVar3 = (int)bytes;
    *(int *)(pdVar1 + append_data->row_count * 4) = iVar3;
    ArrowBuffer::resize(this_00,bytes);
    local_40 = *puVar2;
    local_38 = (void *)puVar2[1];
    __src = local_38;
    if ((uint)local_40 < 0xd) {
      __src = (void *)((long)&local_40 + 4);
    }
    switchD_016b0717::default(this_00->dataptr + lVar4,__src,local_40 & 0xffffffff);
    puVar2 = puVar2 + 2;
  }
  append_data->row_count = append_data->row_count + size;
  return;
}

Assistant:

static void EnumAppendVector(ArrowAppendData &append_data, const Vector &input, idx_t size) {
		D_ASSERT(input.GetVectorType() == VectorType::FLAT_VECTOR);
		auto &main_buffer = append_data.GetMainBuffer();
		auto &aux_buffer = append_data.GetAuxBuffer();
		// resize the validity mask and set up the validity buffer for iteration
		ResizeValidity(append_data.GetValidityBuffer(), append_data.row_count + size);

		// resize the offset buffer - the offset buffer holds the offsets into the child array
		main_buffer.resize(main_buffer.size() + sizeof(int32_t) * (size + 1));
		auto data = FlatVector::GetData<string_t>(input);
		auto offset_data = main_buffer.GetData<int32_t>();
		if (append_data.row_count == 0) {
			// first entry
			offset_data[0] = 0;
		}
		// now append the string data to the auxiliary buffer
		// the auxiliary buffer's length depends on the string lengths, so we resize as required
		auto last_offset = offset_data[append_data.row_count];
		for (idx_t i = 0; i < size; i++) {
			auto offset_idx = append_data.row_count + i + 1;

			auto string_length = GetLength(data[i]);

			// append the offset data
			auto current_offset = UnsafeNumericCast<idx_t>(last_offset) + string_length;
			offset_data[offset_idx] = UnsafeNumericCast<int32_t>(current_offset);

			// resize the string buffer if required, and write the string data
			aux_buffer.resize(current_offset);
			WriteData(aux_buffer.data() + last_offset, data[i]);

			last_offset = UnsafeNumericCast<int32_t>(current_offset);
		}
		append_data.row_count += size;
	}